

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O3

void solver2_logging_order_rec(sat_solver2 *s,int x)

{
  int *piVar1;
  varinfo2 *pvVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  ulong uVar6;
  int iVar7;
  
  pvVar2 = s->vi;
  bVar5 = *(byte *)(pvVar2 + x);
  if ((bVar5 & 0x20) == 0) {
    uVar3 = (s->Mem).uPageMask & s->reasons[x];
    if (uVar3 == 0) {
      __assert_fail("k",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satClause.h"
                    ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
    }
    piVar1 = (s->Mem).pPages[s->reasons[x] >> ((byte)(s->Mem).nPageSize & 0x1f)];
    uVar4 = piVar1[(int)uVar3];
    if (0xfff < uVar4) {
      uVar6 = 1;
      do {
        if ((uint)piVar1[(long)(int)uVar3 + uVar6 + 1] < 2) break;
        iVar7 = piVar1[(long)(int)uVar3 + uVar6 + 1] >> 1;
        if ((s->levels[iVar7] != 0) && (((uint)s->vi[iVar7] & 4) == 0)) {
          solver2_logging_order_rec(s,iVar7);
          uVar4 = piVar1[(int)uVar3];
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar4 >> 0xb);
      pvVar2 = s->vi;
      bVar5 = *(byte *)(pvVar2 + x);
    }
    if ((bVar5 & 0x3c) == 0) {
      uVar3 = (s->tagged).size;
      if (uVar3 == (s->tagged).cap) {
        iVar7 = (uVar3 >> 1) * 3;
        if ((int)uVar3 < 4) {
          iVar7 = uVar3 * 2;
        }
        piVar1 = (s->tagged).ptr;
        if (piVar1 == (int *)0x0) {
          piVar1 = (int *)malloc((long)iVar7 << 2);
        }
        else {
          piVar1 = (int *)realloc(piVar1,(long)iVar7 << 2);
        }
        (s->tagged).ptr = piVar1;
        if (piVar1 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)(s->tagged).cap * 9.5367431640625e-07,(double)iVar7 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->tagged).cap = iVar7;
        uVar3 = (s->tagged).size;
        pvVar2 = s->vi;
      }
      (s->tagged).size = uVar3 + 1;
      (s->tagged).ptr[(int)uVar3] = x;
      bVar5 = *(byte *)(pvVar2 + x);
    }
    *(byte *)(pvVar2 + x) = bVar5 | 0x20;
    uVar3 = (s->min_step_order).size;
    if (uVar3 == (s->min_step_order).cap) {
      iVar7 = (uVar3 >> 1) * 3;
      if ((int)uVar3 < 4) {
        iVar7 = uVar3 * 2;
      }
      piVar1 = (s->min_step_order).ptr;
      if (piVar1 == (int *)0x0) {
        piVar1 = (int *)malloc((long)iVar7 << 2);
      }
      else {
        piVar1 = (int *)realloc(piVar1,(long)iVar7 << 2);
      }
      (s->min_step_order).ptr = piVar1;
      if (piVar1 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)(s->min_step_order).cap * 9.5367431640625e-07,
               (double)iVar7 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      (s->min_step_order).cap = iVar7;
      uVar3 = (s->min_step_order).size;
    }
    (s->min_step_order).size = uVar3 + 1;
    (s->min_step_order).ptr[(int)uVar3] = x;
  }
  return;
}

Assistant:

static void solver2_logging_order_rec(sat_solver2* s, int x)
{
    clause* c;
    int i, y;
    if ( (var_tag(s,x) & 8) )
        return;
    c = clause2_read(s, var_reason(s,x));
    clause_foreach_var( c, y, i, 1 )
        if ( var_level(s,y) && (var_tag(s,y) & 1) == 0 )
            solver2_logging_order_rec(s, y);
    var_add_tag(s, x, 8);
    veci_push(&s->min_step_order, x);
}